

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMImage * MT32Emu::ROMImage::makeROMImage(File *file)

{
  ROMImage *this;
  ROMInfo **romInfos;
  File *file_local;
  
  this = (ROMImage *)operator_new(0x18);
  romInfos = getKnownROMInfoList();
  ROMImage(this,file,false,romInfos);
  return this;
}

Assistant:

const ROMImage *ROMImage::makeROMImage(File *file) {
	return new ROMImage(file, false, getKnownROMInfoList());
}